

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

DispatchCallResult __thiscall
capnproto_test::capnp::test::TestMoreStuff::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
  CVar1;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,_capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,_capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,_capnproto_test::capnp::test::TestMoreStuff::HoldResults>
  CVar4;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,_capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
  CVar5;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,_capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
  CVar6;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,_capnproto_test::capnp::test::TestMoreStuff::EchoResults>
  CVar7;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,_capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
  CVar8;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
  CVar9;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,_capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
  CVar10;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,_capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
  CVar11;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,_capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
  CVar12;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,_capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
  CVar13;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,_capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>
  CVar14;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
  CVar15;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
  CVar16;
  CallContext<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,_capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
  CVar17;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined6 in_register_00000032;
  long *plVar19;
  DispatchCallResult DVar20;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  undefined8 uVar18;
  
  plVar19 = (long *)CONCAT62(in_register_00000032,methodId);
  switch((ulong)context.hook & 0xffff) {
  case 0:
    CVar1 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::CallFooParams,capnproto_test::capnp::test::TestMoreStuff::CallFooResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x10))(this,plVar19,CVar1.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX;
    break;
  case 1:
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x18))(this,plVar19,CVar2.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_00;
    break;
  case 2:
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x20))(this,plVar19,CVar3.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 1;
    uVar18 = extraout_RDX_01;
    break;
  case 3:
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::HoldParams,capnproto_test::capnp::test::TestMoreStuff::HoldResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x28))(this,plVar19,CVar4.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_02;
    break;
  case 4:
    CVar5 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x30))(this,plVar19,CVar5.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_03;
    break;
  case 5:
    CVar6 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x38))(this,plVar19,CVar6.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_04;
    break;
  case 6:
    CVar7 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::EchoParams,capnproto_test::capnp::test::TestMoreStuff::EchoResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x40))(this,plVar19,CVar7.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_05;
    break;
  case 7:
    CVar8 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x48))(this,plVar19,CVar8.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 1;
    uVar18 = extraout_RDX_06;
    break;
  case 8:
    CVar9 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>
                      ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x50))(this,plVar19,CVar9.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_07;
    break;
  case 9:
    CVar10 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x58))(this,plVar19,CVar10.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_08;
    break;
  case 10:
    CVar11 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::GetNullParams,capnproto_test::capnp::test::TestMoreStuff::GetNullResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x60))(this,plVar19,CVar11.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_09;
    break;
  case 0xb:
    CVar12 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x68))(this,plVar19,CVar12.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_10;
    break;
  case 0xc:
    CVar13 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x70))(this,plVar19,CVar13.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_11;
    break;
  case 0xd:
    CVar14 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x78))(this,plVar19,CVar14.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_12;
    break;
  case 0xe:
    CVar15 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x80))(this,plVar19,CVar15.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_13;
    break;
  case 0xf:
    CVar16 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x88))(this,plVar19,CVar16.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_14;
    break;
  case 0x10:
    CVar17 = ::capnp::Capability::Server::
             internalGetTypedContext<capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>
                       ((Server *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),in_RCX);
    (**(code **)(*plVar19 + 0x90))(this,plVar19,CVar17.hook);
    this->field_0x8 = 0;
    this->field_0x9 = 0;
    uVar18 = extraout_RDX_15;
    break;
  default:
    DVar20 = ::capnp::Capability::Server::internalUnimplemented
                       ((Server *)this,(char *)((long)plVar19 + *(long *)(*plVar19 + -0x18)),
                        0xa339c2,0x33cf);
    uVar18 = DVar20._8_8_;
  }
  DVar20.isStreaming = (bool)(char)uVar18;
  DVar20.allowCancellation = (bool)(char)((ulong)uVar18 >> 8);
  DVar20._10_6_ = (int6)((ulong)uVar18 >> 0x10);
  DVar20.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)this;
  return DVar20;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestMoreStuff::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return {
        callFoo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallFooParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooResults>(context)),
        false,
        false
      };
    case 1:
      return {
        callFooWhenResolved(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>(context)),
        false,
        false
      };
    case 2:
      return {
        neverReturn(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::NeverReturnParams,  ::capnproto_test::capnp::test::TestMoreStuff::NeverReturnResults>(context)),
        false,
        true
      };
    case 3:
      return {
        hold(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::HoldParams,  ::capnproto_test::capnp::test::TestMoreStuff::HoldResults>(context)),
        false,
        false
      };
    case 4:
      return {
        callHeld(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::CallHeldParams,  ::capnproto_test::capnp::test::TestMoreStuff::CallHeldResults>(context)),
        false,
        false
      };
    case 5:
      return {
        getHeld(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetHeldParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetHeldResults>(context)),
        false,
        false
      };
    case 6:
      return {
        echo(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::EchoParams,  ::capnproto_test::capnp::test::TestMoreStuff::EchoResults>(context)),
        false,
        false
      };
    case 7:
      return {
        expectCancel(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ExpectCancelParams,  ::capnproto_test::capnp::test::TestMoreStuff::ExpectCancelResults>(context)),
        false,
        true
      };
    case 8:
      return {
        methodWithDefaults(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithDefaultsResults>(context)),
        false,
        false
      };
    case 9:
      return {
        getHandle(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetHandleParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetHandleResults>(context)),
        false,
        false
      };
    case 10:
      return {
        getNull(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetNullParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetNullResults>(context)),
        false,
        false
      };
    case 11:
      return {
        getEnormousString(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringParams,  ::capnproto_test::capnp::test::TestMoreStuff::GetEnormousStringResults>(context)),
        false,
        false
      };
    case 12:
      return {
        methodWithNullDefault(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultParams,  ::capnproto_test::capnp::test::TestMoreStuff::MethodWithNullDefaultResults>(context)),
        false,
        false
      };
    case 13:
      return {
        writeToFd(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::WriteToFdParams,  ::capnproto_test::capnp::test::TestMoreStuff::WriteToFdResults>(context)),
        false,
        false
      };
    case 14:
      return {
        throwException(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionResults>(context)),
        false,
        false
      };
    case 15:
      return {
        throwRemoteException(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowRemoteExceptionResults>(context)),
        false,
        false
      };
    case 16:
      return {
        throwExceptionWithDetail(::capnp::Capability::Server::internalGetTypedContext<
             ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailParams,  ::capnproto_test::capnp::test::TestMoreStuff::ThrowExceptionWithDetailResults>(context)),
        false,
        false
      };
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestMoreStuff",
          0xddc70bf9784133cfull, methodId);
  }
}